

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O0

bool s_send_raw(socket_t *socket,string_view payload,int flags)

{
  size_type sVar1;
  const_pointer __src;
  ssize_t sVar2;
  uint in_ECX;
  undefined4 in_register_0000000c;
  socket_base *in_RDI;
  int in_R8D;
  message_t message;
  message_t *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  message_t *in_stack_ffffffffffffff90;
  undefined1 local_60 [68];
  uint local_1c;
  socket_base *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  zmq::message_t::message_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  if (sVar1 != 0) {
    in_stack_ffffffffffffff80 = (message_t *)zmq::message_t::data(in_stack_ffffffffffffff80);
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    memcpy(in_stack_ffffffffffffff80,__src,sVar1);
  }
  sVar2 = zmq::detail::socket_base::send
                    (local_18,(int)local_60,(void *)(ulong)local_1c,
                     CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  zmq::message_t::~message_t(in_stack_ffffffffffffff80);
  return (bool)((byte)sVar2 & 1);
}

Assistant:

bool s_send_raw(zmq::socket_t *socket, std::string_view payload,
                int flags = 0) {
    zmq::message_t message(payload.size());
    if (payload.size()) {
        ::memcpy(message.data(), payload.data(), payload.size());
    }
    return socket->send(message, flags);
}